

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void SPARSITY_PREPROC_SYST_CSR(int *colVals,int *rowPtr,int *consP,int NCELLS,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  double *pdVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  double *pdVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int k;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  undefined4 uVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  GpuArray<double,_100U> Jac;
  Real c_R [9];
  Real dcRdT [9];
  double adStack_600 [11];
  undefined1 local_5a8 [16];
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  undefined1 local_578 [16];
  undefined8 local_568;
  double local_558;
  double dStack_550;
  double local_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  undefined8 local_518;
  double local_508;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double dStack_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0 [2];
  double adStack_4c0 [44];
  undefined1 auStack_360 [16];
  double local_350;
  double dStack_348;
  double local_340;
  double local_328;
  double dStack_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double dStack_2f8;
  double local_2f0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double dStack_2a8;
  double local_2a0;
  double local_238 [9];
  double local_1f0;
  double local_1e8 [5];
  undefined1 auStack_1c0 [16];
  undefined1 local_1b0 [24];
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  int local_14c;
  double local_148;
  double local_138;
  double local_128;
  double local_120;
  double local_118 [10];
  double local_c8 [10];
  double local_78 [9];
  
  adStack_600[0] = 6.25308255871224e-318;
  local_14c = base;
  memset(&local_508,0,800);
  adStack_600[7] = 0.0;
  adStack_600[8] = 0.0;
  adStack_600[5] = 0.0;
  adStack_600[6] = 0.0;
  adStack_600[3] = 0.0;
  adStack_600[4] = 0.0;
  adStack_600[1] = 0.0;
  adStack_600[2] = 0.0;
  adStack_600[9] = 0.0;
  lVar12 = 1;
  auVar36 = _DAT_006979b0;
  do {
    if (SUB164(auVar36 ^ _DAT_006979c0,4) == -0x80000000 &&
        SUB164(auVar36 ^ _DAT_006979c0,0) < -0x7ffffff7) {
      adStack_600[lVar12] = 0.1111111111111111;
      adStack_600[lVar12 + 1] = 0.1111111111111111;
    }
    lVar15 = auVar36._8_8_;
    auVar36._0_8_ = auVar36._0_8_ + 2;
    auVar36._8_8_ = lVar15 + 2;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 0xb);
  iVar14 = *consP;
  pdVar18 = &local_508;
  lVar12 = 0;
  adStack_600[0] = 6.25399163950058e-318;
  memset(pdVar18,0,800);
  local_578 = (undefined1  [16])0x0;
  local_588 = 0.0;
  dStack_580 = 0.0;
  local_598 = 0.0;
  dStack_590 = 0.0;
  local_5a8 = (undefined1  [16])0x0;
  local_568 = 0;
  local_178 = 0.0;
  do {
    local_178 = local_178 + adStack_600[lVar12 + 1];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 9);
  local_558 = 2.911342024497792;
  dStack_550 = 3.254512984911126;
  local_548 = -15.528347679998124;
  dStack_540 = 19.481084666666668;
  local_538 = 22.009669090999374;
  dStack_530 = 5.94295186894925;
  local_528 = 5.3818731557687505;
  dStack_520 = -5.101694818407498;
  local_518 = 0x4008a2a8a3a0d57d;
  local_180 = adStack_600[3] * 10.0 +
              adStack_600[2] * -0.21999999999999997 + adStack_600[1] + local_178;
  local_158 = adStack_600[2] * adStack_600[4];
  dVar22 = ((local_180 * 1e-12) / 118698922.25997423) * 1838773899538452.5;
  local_188 = dVar22 + 1.0;
  local_160 = dVar22 / local_188;
  local_168 = -0.0006207345732258481 / local_188;
  adStack_600[0] = 6.25556276825436e-318;
  local_198 = log10(dVar22);
  adStack_600[0] = 6.25567146269644e-318;
  local_190 = exp(-1.5e+33);
  local_190 = local_190 * 0.19999999999999996;
  local_138 = local_190 + 0.8;
  adStack_600[0] = 6.25590367354999e-318;
  local_128 = log10(local_138);
  local_148 = local_128 * -1.27 + 0.75;
  local_170 = local_128 * -0.67 + -0.4 + local_198;
  local_198 = 1.0 / (local_170 * -0.14 + local_148);
  local_170 = local_170 * local_198;
  local_120 = 1.0 / (local_170 * local_170 + 1.0);
  adStack_600[0] = 6.25676828843021e-318;
  dVar22 = pow(10.0,local_128 * local_120);
  dVar53 = (local_128 + local_128) * local_120 * local_120 * local_170 * local_198;
  dVar46 = -local_148 * dVar53 * local_198;
  dVar22 = dVar22 * local_160;
  dVar47 = (local_158 * 118698922.25997423 + adStack_600[7] * -11503468.582662737) * dVar22;
  dVar53 = (local_158 * 47479.56890398969 +
           (((local_528 - (dStack_550 + dStack_540)) + 1.0) * -0.0006666666666666666 +
           0.00039999999999999996) * -11503468.582662737 * adStack_600[7]) * dVar22 +
           (dVar46 * -0.0006207345732258481 +
            (dVar53 * local_170 * -1.27 + dVar46 * -0.67 + local_120) *
            (local_190 / -1e-30 + -8e-31) * (0.43429448190325176 / local_138) + local_168) *
           2.302585092994046 * dVar47;
  local_5a8._8_8_ = (double)local_5a8._8_8_ - dVar47;
  dStack_590 = dStack_590 - dVar47;
  local_578._0_8_ = (double)local_578._0_8_ + dVar47;
  dVar46 = (1.0 / local_188 + dVar46) * (dVar47 / local_180);
  dVar47 = dVar22 * 118698922.25997423;
  dVar22 = dVar22 * 11503468.582662737;
  if (iVar14 == 0) {
    local_1e8[0] = dVar46 + dVar46;
    local_1e8[1] = dVar46 * 0.78 + adStack_600[4] * dVar47;
    local_1e8[2] = dVar46 * 11.0;
    local_1e8[3] = dVar47 * adStack_600[2] + dVar46;
    local_1e8[4] = dVar46;
    auStack_1c0._8_8_ = dVar46 - dVar22;
    auStack_1c0._0_8_ = dVar46;
    local_1b0._8_8_ = dVar46;
    local_1b0._0_8_ = dVar46;
    pdVar13 = &dStack_500;
    lVar12 = 0;
    do {
      dVar22 = local_1e8[lVar12];
      *pdVar13 = *pdVar13 - dVar22;
      pdVar13[2] = pdVar13[2] - dVar22;
      pdVar13[5] = dVar22 + pdVar13[5];
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dStack_500 = dStack_500 - dVar46;
    dStack_4f0 = dStack_4f0 - dVar46;
    local_4d8 = local_4d8 + dVar46;
    dVar63 = dVar46 * -0.21999999999999997 + adStack_600[4] * dVar47;
    adStack_4c0[2] = adStack_4c0[2] - dVar63;
    adStack_4c0[4] = adStack_4c0[4] - dVar63;
    adStack_4c0[7] = dVar63 + adStack_4c0[7];
    dVar46 = dVar46 * 10.0;
    adStack_4c0[0xc] = adStack_4c0[0xc] - dVar46;
    adStack_4c0[0xe] = adStack_4c0[0xe] - dVar46;
    adStack_4c0[0x11] = dVar46 + adStack_4c0[0x11];
    dVar47 = dVar47 * adStack_600[2];
    adStack_4c0[0x16] = adStack_4c0[0x16] - dVar47;
    adStack_4c0[0x18] = adStack_4c0[0x18] - dVar47;
    adStack_4c0[0x1b] = dVar47 + adStack_4c0[0x1b];
    dStack_320 = dStack_320 + dVar22;
    local_310 = local_310 + dVar22;
    dStack_2f8 = dStack_2f8 - dVar22;
  }
  local_238[1] = local_238[1] - dVar53;
  local_238[3] = local_238[3] - dVar53;
  local_238[6] = dVar53 + local_238[6];
  local_180 = adStack_600[3] * 11.0 + adStack_600[1] * 1.5 + local_178;
  local_188 = adStack_600[8];
  local_158 = ((local_180 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  adStack_600[0] = 6.26279094865302e-318;
  local_190 = log10(local_158);
  adStack_600[0] = 6.2628996430951e-318;
  local_160 = exp(-1.5e+33);
  local_160 = local_160 * 0.5;
  local_168 = local_160 + 0.5;
  adStack_600[0] = 6.26311209132281e-318;
  local_170 = log10(local_168);
  local_138 = local_170 * -1.27 + 0.75;
  local_148 = local_170 * -0.67 + -0.4 + local_190;
  local_190 = 1.0 / (local_148 * -0.14 + local_138);
  local_148 = local_148 * local_190;
  local_198 = 1.0 / (local_148 * local_148 + 1.0);
  adStack_600[0] = 6.26403599408054e-318;
  dVar22 = pow(10.0,local_170 * local_198);
  dVar53 = (local_170 + local_170) * local_198 * local_198 * local_148 * local_190;
  local_190 = -local_138 * dVar53 * local_190;
  dVar46 = local_158 + 1.0;
  dVar22 = (local_158 / dVar46) * dVar22;
  dVar47 = (local_188 * 25936106.98548031 + adStack_600[6] * adStack_600[6] * -3419315.29664768) *
           dVar22;
  dVar53 = (local_188 * 280925.8837546357 +
           ((((dStack_530 + dStack_530) - dStack_520) + -1.0) * -0.0006666666666666666 +
           0.010831459166632262) * -3419315.29664768 * adStack_600[6] * adStack_600[6]) * dVar22 +
           (local_190 * -0.0002845931413337665 +
            (dVar53 * local_148 * -1.27 + local_190 * -0.67 + local_198) *
            (local_160 / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / local_168) +
           -0.0002845931413337665 / dVar46) * 2.302585092994046 * dVar47;
  dStack_580 = dVar47 + dVar47 + dStack_580;
  local_578._8_8_ = (double)local_578._8_8_ - dVar47;
  local_1e8[1] = (1.0 / dVar46 + local_190) * (dVar47 / local_180);
  dVar46 = dVar22 * 25936106.98548031;
  if (iVar14 == 0) {
    local_1e8[0] = local_1e8[1] * 2.5;
    local_1e8[2] = local_1e8[1] * 12.0;
    local_1e8[3] = local_1e8[1];
    local_1e8[4] = local_1e8[1];
    auStack_1c0._8_8_ = local_1e8[1];
    auStack_1c0._0_8_ = dVar22 * 3419315.29664768 * -2.0 * adStack_600[6] + local_1e8[1];
    local_1b0._8_8_ = local_1e8[1];
    local_1b0._0_8_ = dVar46 + local_1e8[1];
    pdVar13 = local_4d0;
    lVar12 = 0;
    do {
      dVar22 = local_1e8[lVar12];
      pdVar13[-2] = dVar22 + dVar22 + pdVar13[-2];
      *pdVar13 = *pdVar13 - dVar22;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar47 = local_1e8[1] * 1.5;
    local_4e0 = dVar47 + dVar47 + local_4e0;
    local_4d0[0] = local_4d0[0] - dVar47;
    local_1e8[1] = local_1e8[1] * 11.0;
    adStack_4c0[0x10] = local_1e8[1] + local_1e8[1] + adStack_4c0[0x10];
    adStack_4c0[0x12] = adStack_4c0[0x12] - local_1e8[1];
    dVar22 = dVar22 * 3419315.29664768 * -2.0 * adStack_600[6];
    local_350 = dVar22 + dVar22 + local_350;
    local_340 = local_340 - dVar22;
    local_2b0 = dVar46 + dVar46 + local_2b0;
    local_2a0 = local_2a0 - dVar46;
  }
  local_238[5] = dVar53 + dVar53 + local_238[5];
  local_238[7] = local_238[7] - dVar53;
  dVar46 = adStack_600[3] * 11.0 + adStack_600[1] * 1.5 + local_178;
  local_1e8[1] = adStack_600[1] * 1.0145869685785861e-06 +
                 adStack_600[4] * adStack_600[4] * -407.1662961015109;
  dVar47 = dVar46 * local_1e8[1];
  dVar22 = (adStack_600[1] * 2.2738361995042403e-08 +
           ((((dStack_540 + dStack_540) - local_558) + -1.0) * -0.0006666666666666666 +
           0.022411446922976298) * -407.1662961015109 * adStack_600[4] * adStack_600[4]) * dVar46;
  local_5a8._0_8_ = (double)local_5a8._0_8_ - dVar47;
  dStack_590 = dVar47 + dVar47 + dStack_590;
  if (iVar14 == 0) {
    local_1e8[0] = local_1e8[1] * 2.5 + dVar46 * 1.0145869685785861e-06;
    local_1e8[2] = local_1e8[1] * 12.0;
    local_1e8[3] = dVar46 * 407.1662961015109 * -2.0 * adStack_600[4] + local_1e8[1];
    local_1e8[4] = local_1e8[1];
    auStack_1c0._8_8_ = local_1e8[1];
    auStack_1c0._0_8_ = local_1e8[1];
    local_1b0._8_8_ = local_1e8[1];
    local_1b0._0_8_ = local_1e8[1];
    pdVar13 = &local_508;
    lVar12 = 0;
    do {
      dVar46 = local_1e8[lVar12];
      *pdVar13 = *pdVar13 - dVar46;
      pdVar13[3] = dVar46 + dVar46 + pdVar13[3];
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar47 = local_1e8[1] * 1.5 + dVar46 * 1.0145869685785861e-06;
    local_508 = local_508 - dVar47;
    dStack_4f0 = dVar47 + dVar47 + dStack_4f0;
    local_1e8[1] = local_1e8[1] * 11.0;
    adStack_4c0[0xb] = adStack_4c0[0xb] - local_1e8[1];
    dVar46 = dVar46 * 407.1662961015109 * -2.0 * adStack_600[4];
    adStack_4c0[0xe] = local_1e8[1] + local_1e8[1] + adStack_4c0[0xe];
    adStack_4c0[0x15] = adStack_4c0[0x15] - dVar46;
    adStack_4c0[0x18] = dVar46 + dVar46 + adStack_4c0[0x18];
  }
  local_238[0] = local_238[0] - dVar22;
  local_238[3] = dVar22 + dVar22 + local_238[3];
  dVar47 = adStack_600[3] * 11.0 + adStack_600[1] * 1.5 + local_178;
  local_1e8[3] = adStack_600[5] * adStack_600[5] * 159.17961552912485 +
                 adStack_600[2] * -2.0846475553480232e-08;
  dVar46 = dVar47 * local_1e8[3];
  dVar22 = (adStack_600[5] * adStack_600[5] * -0.05305987184304161 +
           (((dStack_550 - (local_538 + local_538)) + 1.0) * -0.0006666666666666666 +
           -0.0003333333333333333) * -2.0846475553480232e-08 * adStack_600[2]) * dVar47;
  local_5a8._8_8_ = (double)local_5a8._8_8_ + dVar46;
  local_588 = local_588 - (dVar46 + dVar46);
  dVar46 = dVar47 * 159.17961552912485;
  dVar47 = dVar47 * 2.0846475553480232e-08;
  if (iVar14 == 0) {
    local_1e8[0] = local_1e8[3] * 2.5;
    local_1e8[1] = local_1e8[3] - dVar47;
    local_1e8[2] = local_1e8[3] * 12.0;
    local_1e8[4] = (dVar46 + dVar46) * adStack_600[5] + local_1e8[3];
    uVar52 = (undefined4)((ulong)local_1e8[3] >> 0x20);
    local_1b0._8_4_ = SUB84(local_1e8[3],0);
    local_1b0._0_8_ = local_1e8[3];
    local_1b0._12_4_ = uVar52;
    auStack_1c0._8_4_ = SUB84(local_1e8[3],0);
    auStack_1c0._0_8_ = local_1e8[3];
    auStack_1c0._12_4_ = uVar52;
    pdVar13 = &dStack_500;
    lVar12 = 0;
    do {
      dVar46 = local_1e8[lVar12];
      *pdVar13 = *pdVar13 + dVar46;
      pdVar13[3] = pdVar13[3] - (dVar46 + dVar46);
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar53 = local_1e8[3] * 1.5;
    dStack_500 = dStack_500 + dVar53;
    dStack_4e8 = dStack_4e8 - (dVar53 + dVar53);
    adStack_4c0[2] = adStack_4c0[2] - dVar47;
    adStack_4c0[5] = adStack_4c0[5] - dVar47 * -2.0;
    local_1e8[3] = local_1e8[3] * 11.0;
    adStack_4c0[0xc] = adStack_4c0[0xc] + local_1e8[3];
    dVar46 = (dVar46 + dVar46) * adStack_600[5];
    adStack_4c0[0xf] = adStack_4c0[0xf] - (local_1e8[3] + local_1e8[3]);
    adStack_4c0[0x20] = adStack_4c0[0x20] + dVar46;
    adStack_4c0[0x23] = adStack_4c0[0x23] - (dVar46 + dVar46);
  }
  local_238[1] = local_238[1] + dVar22;
  local_238[4] = local_238[4] - (dVar22 + dVar22);
  local_1e8[1] = adStack_600[4] * adStack_600[5] * 3142.6666666666665 +
                 adStack_600[6] * -5.646680545093694e-06;
  dVar53 = adStack_600[3] * 11.0 + adStack_600[1] * 1.5 + local_178;
  dVar46 = dVar53 * local_1e8[1];
  dVar47 = (adStack_600[4] * adStack_600[5] * -2.095111111111111 +
           (((dStack_530 - (dStack_540 + local_538)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -5.646680545093694e-06 * adStack_600[6]) * dVar53;
  dVar22 = dStack_590 - dVar46;
  local_588 = local_588 - dVar46;
  auVar1._8_4_ = SUB84(local_588,0);
  auVar1._0_8_ = dVar22;
  auVar1._12_4_ = (int)((ulong)local_588 >> 0x20);
  dStack_590 = dVar22;
  local_588 = auVar1._8_8_;
  dStack_580 = dVar46 + dStack_580;
  dVar46 = dVar53 * 3142.6666666666665;
  dVar53 = dVar53 * 5.646680545093694e-06;
  if (iVar14 == 0) {
    local_1e8[0] = local_1e8[1] * 2.5;
    local_1e8[2] = local_1e8[1] * 12.0;
    local_1e8[3] = adStack_600[5] * dVar46 + local_1e8[1];
    local_1e8[4] = adStack_600[4] * dVar46 + local_1e8[1];
    auStack_1c0._0_8_ = local_1e8[1] - dVar53;
    auStack_1c0._8_8_ = local_1e8[1];
    local_1b0._0_8_ = local_1e8[1];
    local_1b0._8_8_ = local_1e8[1];
    pdVar13 = &local_4e0;
    lVar12 = 0;
    do {
      dVar46 = local_1e8[lVar12];
      pdVar13[-2] = pdVar13[-2] - dVar46;
      pdVar13[-1] = pdVar13[-1] - dVar46;
      *pdVar13 = dVar46 + *pdVar13;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar63 = local_1e8[1] * 1.5;
    dStack_4f0 = dStack_4f0 - dVar63;
    dStack_4e8 = dStack_4e8 - dVar63;
    local_4e0 = dVar63 + local_4e0;
    local_1e8[1] = local_1e8[1] * 11.0;
    adStack_4c0[0xe] = adStack_4c0[0xe] - local_1e8[1];
    adStack_4c0[0xf] = adStack_4c0[0xf] - local_1e8[1];
    adStack_4c0[0x10] = local_1e8[1] + adStack_4c0[0x10];
    dVar63 = adStack_600[5] * dVar46;
    adStack_4c0[0x18] = adStack_4c0[0x18] - dVar63;
    adStack_4c0[0x19] = adStack_4c0[0x19] - dVar63;
    dVar46 = dVar46 * adStack_600[4];
    adStack_4c0[0x1a] = dVar63 + adStack_4c0[0x1a];
    adStack_4c0[0x22] = adStack_4c0[0x22] - dVar46;
    adStack_4c0[0x23] = adStack_4c0[0x23] - dVar46;
    adStack_4c0[0x24] = dVar46 + adStack_4c0[0x24];
    auVar2._8_4_ = SUB84(dVar53 + (double)auStack_360._8_8_,0);
    auVar2._0_8_ = dVar53 + (double)auStack_360._0_8_;
    auVar2._12_4_ = (int)((ulong)(dVar53 + (double)auStack_360._8_8_) >> 0x20);
    auStack_360 = auVar2;
    local_350 = local_350 - dVar53;
  }
  local_238[3] = local_238[3] - dVar47;
  local_238[4] = local_238[4] - dVar47;
  local_238[5] = dVar47 + local_238[5];
  dVar53 = adStack_600[3] * 11.0 + adStack_600[1] * 1.5 + local_178;
  local_1e8[1] = adStack_600[4] * adStack_600[6] * 16888.888888888887 +
                 adStack_600[3] * -1.4321870058604512e-06;
  dVar63 = dVar53 * local_1e8[1];
  dVar46 = (adStack_600[4] * adStack_600[6] * -22.518518518518515 +
           (((local_548 - (dStack_540 + dStack_530)) + 1.0) * -0.0006666666666666666 +
           -0.0013333333333333333) * -1.4321870058604512e-06 * adStack_600[3]) * dVar53;
  local_598 = local_598 + dVar63;
  dStack_590 = dVar22 - dVar63;
  dStack_580 = dStack_580 - dVar63;
  dVar47 = dVar53 * 16888.888888888887;
  if (iVar14 == 0) {
    local_1e8[0] = local_1e8[1] * 2.5;
    local_1e8[2] = -(dVar53 * 1.4321870058604512e-06) + local_1e8[1] * 12.0;
    local_1e8[3] = local_1e8[1] + adStack_600[6] * dVar47;
    local_1e8[4] = local_1e8[1];
    auStack_1c0._8_8_ = local_1e8[1];
    auStack_1c0._0_8_ = dVar47 * adStack_600[4] + local_1e8[1];
    local_1b0._8_8_ = local_1e8[1];
    local_1b0._0_8_ = local_1e8[1];
    pdVar13 = &local_4f8;
    lVar12 = 0;
    do {
      dVar47 = local_1e8[lVar12];
      *pdVar13 = *pdVar13 + dVar47;
      pdVar13[1] = pdVar13[1] - dVar47;
      pdVar13[3] = pdVar13[3] - dVar47;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar54 = local_1e8[1] * 1.5;
    local_4f8 = local_4f8 + dVar54;
    dStack_4f0 = dStack_4f0 - dVar54;
    local_4e0 = local_4e0 - dVar54;
    dVar53 = local_1e8[1] * 11.0 - dVar53 * 1.4321870058604512e-06;
    adStack_4c0[0xd] = adStack_4c0[0xd] + dVar53;
    adStack_4c0[0xe] = adStack_4c0[0xe] - dVar53;
    adStack_4c0[0x10] = adStack_4c0[0x10] - dVar53;
    dVar53 = adStack_600[6] * dVar47;
    adStack_4c0[0x18] = adStack_4c0[0x18] - dVar53;
    adStack_4c0[0x17] = adStack_4c0[0x17] + dVar53;
    adStack_4c0[0x1a] = adStack_4c0[0x1a] - dVar53;
    dVar47 = dVar47 * adStack_600[4];
    adStack_4c0[0x2b] = adStack_4c0[0x2b] + dVar47;
    auStack_360._0_8_ = (double)auStack_360._0_8_ - dVar47;
    local_350 = local_350 - dVar47;
  }
  dVar64 = adStack_600[2] * adStack_600[4] * 694956.7634748495 +
           adStack_600[5] * adStack_600[6] * -9534710.169227276;
  dVar37 = adStack_600[2] * adStack_600[4] * 2391.8538305613447 +
           (0.0034417304158633542 -
           ((local_538 + dStack_530) - (dStack_550 + dStack_540)) * 0.0006666666666666666) *
           -9534710.169227276 * adStack_600[5] * adStack_600[6];
  dVar48 = adStack_600[4] * 694956.7634748495;
  dVar23 = adStack_600[2] * 694956.7634748495;
  dVar24 = adStack_600[6] * -9534710.169227276;
  dVar55 = adStack_600[5] * -9534710.169227276;
  dVar38 = adStack_600[5] * adStack_600[1] * 1860366.9115799016 +
           adStack_600[4] * adStack_600[6] * -1341454.8115373214;
  dVar47 = adStack_600[5] * 1860366.9115799016;
  dStack_4e8 = dStack_4e8 - dVar47;
  dVar49 = adStack_600[5] * adStack_600[1] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((dStack_540 + dStack_530) - (local_558 + local_538)) * 0.0006666666666666666) *
           -1341454.8115373214 * adStack_600[4] * adStack_600[6];
  dVar53 = adStack_600[6] * -1341454.8115373214;
  adStack_4c0[0x19] = (dVar23 + adStack_4c0[0x19]) - dVar53;
  dVar25 = adStack_600[1] * 1860366.9115799016;
  adStack_4c0[0x1f] = adStack_4c0[0x1f] - dVar25;
  adStack_4c0[0x22] = (adStack_4c0[0x22] - dVar24) + dVar25;
  dVar65 = adStack_600[4] * -1341454.8115373214;
  dVar71 = adStack_600[6] * adStack_600[1] * 4271828.084344627 +
           adStack_600[4] * adStack_600[3] * -145376.75098299314;
  dVar26 = adStack_600[6] * 4271828.084344627;
  local_4f8 = dVar26 + local_4f8;
  local_4e0 = (dVar47 + local_4e0) - dVar26;
  dVar27 = adStack_600[4] * -145376.75098299314;
  adStack_4c0[0xb] = adStack_4c0[0xb] - dVar27;
  dVar69 = adStack_600[1] * 4271828.084344627;
  adStack_4c0[0x29] = (adStack_4c0[0x29] - dVar65) - dVar69;
  dVar39 = adStack_600[5] * adStack_600[3] * 86324.17110758815 +
           adStack_600[6] * adStack_600[6] * -1829063.0057653617;
  dVar45 = adStack_600[7] * adStack_600[4] * 12595057.621245861 +
           adStack_600[2] * adStack_600[1] * -0.32384379658070717;
  dVar56 = adStack_600[6] * adStack_600[1] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((local_548 + dStack_540) - (local_558 + dStack_530)) * 0.0006666666666666666) *
           -145376.75098299314 * adStack_600[4] * adStack_600[3];
  dVar78 = adStack_600[5] * adStack_600[3] * 374.95779706744673 +
           (0.00434360147634811 -
           ((dStack_530 + dStack_530) - (local_548 + local_538)) * 0.0006666666666666666) *
           -1829063.0057653617 * adStack_600[6] * adStack_600[6];
  dVar80 = adStack_600[7] * adStack_600[4] * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((local_558 + dStack_550) - (dStack_540 + local_528)) * 0.0006666666666666666) *
           -0.32384379658070717 * adStack_600[2] * adStack_600[1];
  dVar57 = adStack_600[5] * 86324.17110758815;
  adStack_4c0[0xf] = adStack_4c0[0xf] - dVar57;
  dVar28 = adStack_600[3] * 86324.17110758815;
  adStack_4c0[0x21] = adStack_4c0[0x21] - dVar28;
  dVar29 = adStack_600[6] * -3658126.0115307234;
  dVar77 = adStack_600[2] * -0.32384379658070717;
  dStack_500 = dVar77 + dStack_500;
  dVar30 = adStack_600[1] * -0.32384379658070717;
  adStack_4c0[1] = dVar30 + adStack_4c0[1];
  adStack_4c0[4] = (adStack_4c0[4] - dVar48) - dVar30;
  dVar72 = adStack_600[7] * 12595057.621245861;
  dVar74 = adStack_600[4] * 12595057.621245861;
  dVar54 = adStack_600[3] * -145376.75098299314;
  dVar10 = dVar54 + (adStack_4c0[0x18] - dVar23) + dVar53;
  auVar3._8_4_ = SUB84(dVar10,0);
  auVar3._0_8_ = dVar54 + adStack_4c0[0x17];
  auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
  dVar10 = ((dVar37 + local_238[4]) - dVar49) - dVar78;
  dVar11 = (dVar49 + dVar37 + (local_238[5] - dVar46)) - dVar56;
  auVar4._8_4_ = SUB84(dVar11,0);
  auVar4._0_8_ = dVar10;
  auVar4._12_4_ = (int)((ulong)dVar11 >> 0x20);
  local_238[5] = auVar4._8_8_;
  dVar11 = (dVar71 + local_598) - dVar39;
  dVar22 = (dVar71 + ((dVar22 - dVar63) - dVar64) + dVar38) - dVar45;
  auVar5._8_4_ = SUB84(dVar22,0);
  auVar5._0_8_ = dVar11;
  auVar5._12_4_ = (int)((ulong)dVar22 >> 0x20);
  dStack_590 = auVar5._8_8_;
  adStack_4c0[0x16] = dVar72 + (adStack_4c0[0x16] - dVar23);
  adStack_4c0[0x18] = auVar3._8_8_;
  dVar22 = (dVar56 + local_238[2] + dVar46) - dVar78;
  dVar46 = (dVar56 + ((local_238[3] - dVar46) - dVar37) + dVar49) - dVar80;
  auVar6._8_4_ = SUB84(dVar46,0);
  auVar6._0_8_ = dVar22;
  auVar6._12_4_ = (int)((ulong)dVar46 >> 0x20);
  dVar70 = adStack_600[7] * adStack_600[4] * 64119709.90701692 +
           adStack_600[6] * adStack_600[6] * -16.310006106092114;
  dVar58 = adStack_600[7] * adStack_600[4] * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((dStack_530 + dStack_530) - (dStack_540 + local_528)) * 0.0006666666666666666) *
           -16.310006106092114 * adStack_600[6] * adStack_600[6];
  dVar31 = adStack_600[7] * 64119709.90701692;
  dVar40 = adStack_600[6] * -32.62001221218423;
  dVar67 = adStack_600[4] * 64119709.90701692;
  local_238[3] = auVar6._8_8_;
  dVar41 = adStack_600[7] * adStack_600[5] * 32500000.0 +
           adStack_600[6] * adStack_600[2] * -0.6025543492746578;
  dVar46 = adStack_600[7] * adStack_600[5] * 0.0 +
           (0.0 - ((dStack_550 + dStack_530) - (local_538 + local_528)) * 0.0006666666666666666) *
           -0.6025543492746578 * adStack_600[6] * adStack_600[2];
  local_188 = dVar48 + adStack_4c0[5];
  local_180 = dVar48 + adStack_4c0[6];
  local_178 = adStack_4c0[7] - dVar30;
  dVar76 = adStack_600[7] * 32500000.0;
  adStack_4c0[0x20] = (adStack_4c0[0x20] - dVar24) + dVar76;
  dVar32 = adStack_600[2] * -0.6025543492746578;
  dVar73 = adStack_600[5] * 32500000.0;
  dVar33 = adStack_600[6] * 34143562.115192875;
  dVar63 = dVar74 + dStack_320 + dVar73 + dVar33;
  auVar7._8_4_ = SUB84(local_318 + dVar33,0);
  auVar7._0_8_ = dVar63;
  auVar7._12_4_ = (int)((ulong)(local_318 + dVar33) >> 0x20);
  dVar9 = (dVar67 + dVar67 + local_300 + dVar73) - dVar33;
  dVar33 = (((dStack_2f8 - dVar74) - dVar67) - dVar73) - dVar33;
  auVar8._8_4_ = SUB84(dVar33,0);
  auVar8._0_8_ = dVar9;
  auVar8._12_4_ = (int)((ulong)dVar33 >> 0x20);
  dVar79 = adStack_600[8] * -150.1634478502138;
  dVar34 = adStack_600[7] * 15085094.926858293;
  local_318 = auVar7._8_8_;
  dStack_2f8 = auVar8._8_8_;
  dVar42 = adStack_600[2] * -150.1634478502138;
  dVar59 = adStack_600[6] * -0.6025543492746578;
  adStack_4c0[5] = (dVar48 + adStack_4c0[5]) - dVar59;
  dVar43 = adStack_600[3] * -0.029876205886692417;
  adStack_4c0[3] = adStack_4c0[3] + dVar43;
  adStack_4c0[6] = (dVar48 + adStack_4c0[6] + dVar59) - dVar43;
  dVar44 = adStack_600[2] * -0.029876205886692417;
  adStack_4c0[0xc] = adStack_4c0[0xc] + dVar44;
  dVar75 = adStack_600[7] * 34143562.115192875;
  adStack_4c0[0x2a] = (adStack_4c0[0x2a] - dVar55) + dVar32 + dVar75;
  dVar50 = adStack_600[7] * adStack_600[7] * 20212.492175153773 +
           (0.0026797964842987356 -
           ((dStack_550 + dStack_520) - (local_528 + local_528)) * 0.0006666666666666666) *
           -150.1634478502138 * adStack_600[8] * adStack_600[2];
  dVar51 = adStack_600[6] * adStack_600[7] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((dStack_550 + local_548) - (dStack_530 + local_528)) * 0.0006666666666666666) *
           -0.029876205886692417 * adStack_600[2] * adStack_600[3];
  dVar60 = adStack_600[7] * adStack_600[7] * 7542547.463429146 +
           adStack_600[8] * adStack_600[2] * -150.1634478502138;
  dVar62 = adStack_600[6] * adStack_600[7] * 34143562.115192875 +
           adStack_600[2] * adStack_600[3] * -0.029876205886692417;
  dVar68 = adStack_600[7] * adStack_600[7] * 224556.7351007675 +
           adStack_600[8] * adStack_600[2] * -4.470666408692084;
  dVar33 = adStack_600[7] * adStack_600[7] * -81.82756742036453 +
           (-0.0003643959615980579 -
           ((dStack_550 + dStack_520) - (local_528 + local_528)) * 0.0006666666666666666) *
           -4.470666408692084 * adStack_600[8] * adStack_600[2];
  dVar35 = adStack_600[8] * -4.470666408692084;
  adStack_4c0[2] = dVar30 + (adStack_4c0[2] - dVar48) + dVar59 + dVar43 + dVar79 + dVar35;
  adStack_4c0[7] =
       ((((adStack_4c0[7] - dVar30) - dVar59) - dVar43) - (dVar79 + dVar79)) - (dVar35 + dVar35);
  adStack_4c0[8] = dVar35 + adStack_4c0[8] + dVar79;
  dVar35 = adStack_600[7] * 449113.470201535;
  adStack_600[2] = adStack_600[2] * -4.470666408692084;
  local_2d0 = local_2d0 + dVar42 + adStack_600[2];
  local_238[1] = (local_238[1] - dVar37) + dVar80 + dVar46 + dVar51 + dVar50 + dVar33;
  dVar66 = adStack_600[8] * adStack_600[4] * 6362141.693962547 +
           adStack_600[3] * adStack_600[6] * -7.112730406981104e-05;
  dVar61 = adStack_600[8] * adStack_600[4] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((local_548 + dStack_530) - (dStack_540 + dStack_520)) * 0.0006666666666666666) *
           -7.112730406981104e-05 * adStack_600[3] * adStack_600[6];
  dVar43 = adStack_600[6] * -7.112730406981104e-05;
  adStack_4c0[0xe] = (dVar27 + adStack_4c0[0xe]) - dVar43;
  dVar48 = adStack_600[8] * 6362141.693962547;
  adStack_4c0[0x1a] = dVar31 + dVar31 + ((dVar53 + dVar23 + adStack_4c0[0x1a]) - dVar54) + dVar48;
  dVar37 = adStack_600[3] * -7.112730406981104e-05;
  dVar23 = adStack_600[4] * 6362141.693962547;
  dVar30 = adStack_600[8] * adStack_600[4] * 3347824.3674030215 +
           adStack_600[1] * adStack_600[7] * -4323.663734083463;
  dVar79 = adStack_600[8] * adStack_600[4] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((local_558 + local_528) - (dStack_540 + dStack_520)) * 0.0006666666666666666) *
           -4323.663734083463 * adStack_600[1] * adStack_600[7];
  local_5a8._8_8_ = dVar45 + ((double)local_5a8._8_8_ - dVar64) + dVar41 + dVar62 + dVar60 + dVar68;
  local_5a8._0_8_ = dVar45 + (((double)local_5a8._0_8_ - dVar38) - dVar71) + dVar30;
  dStack_590 = ((dStack_590 - dVar70) - dVar66) - dVar30;
  dVar59 = adStack_600[7] * -4323.663734083463;
  local_508 = dVar77 + ((local_508 - dVar47) - dVar26) + dVar59;
  dStack_4f0 = ((dVar26 + dStack_4f0 + dVar47) - dVar77) - dVar59;
  local_4d8 = (local_4d8 - dVar77) + dVar59;
  local_4d0[0] = local_4d0[0] - dVar59;
  dVar47 = adStack_600[8] * 3347824.3674030215;
  adStack_4c0[0x15] = dVar72 + ((adStack_4c0[0x15] - dVar53) - dVar54) + dVar47;
  adStack_4c0[0x18] = (((adStack_4c0[0x18] - dVar72) - dVar31) - dVar48) - dVar47;
  adStack_4c0[0x17] = dVar54 + adStack_4c0[0x17] + dVar48;
  adStack_4c0[0x1b] = ((adStack_4c0[0x1b] - dVar72) - dVar31) + dVar47;
  adStack_600[1] = adStack_600[1] * -4323.663734083463;
  adStack_4c0[0x1c] = (adStack_4c0[0x1c] - dVar48) - dVar47;
  local_328 = dVar74 + local_328 + adStack_600[1];
  local_310 = ((local_310 - dVar74) - dVar67) - adStack_600[1];
  adStack_600[4] = adStack_600[4] * 3347824.3674030215;
  local_2d8 = local_2d8 + adStack_600[4];
  local_2c0 = (local_2c0 - dVar23) - adStack_600[4];
  local_238[0] = ((local_238[0] - dVar49) - dVar56) + dVar80 + dVar79;
  dVar31 = adStack_600[8] * adStack_600[5] * 5672469.694980093 +
           adStack_600[7] * adStack_600[6] * -5282.492258864639;
  dVar47 = adStack_600[8] * adStack_600[5] * 12599.866574880663 +
           (0.0022212311836643283 -
           ((dStack_530 + local_528) - (local_538 + dStack_520)) * 0.0006666666666666666) *
           -5282.492258864639 * adStack_600[7] * adStack_600[6];
  local_588 = ((((dVar64 + local_588) - dVar38) - dVar39) - dVar41) - dVar31;
  dVar53 = adStack_600[8] * 5672469.694980093;
  adStack_4c0[0x23] = ((((dVar24 + adStack_4c0[0x23]) - dVar25) - dVar28) - dVar76) - dVar53;
  adStack_4c0[0x24] = dVar53 + dVar28 + dVar28 + dVar25 + dVar24 + adStack_4c0[0x24] + dVar76;
  adStack_4c0[0x25] = dVar53 + (adStack_4c0[0x25] - dVar76);
  adStack_4c0[0x26] = adStack_4c0[0x26] - dVar53;
  dVar48 = adStack_600[7] * -5282.492258864639;
  auStack_360._8_8_ = ((((dVar55 + (double)auStack_360._8_8_) - dVar65) - dVar29) - dVar32) - dVar48
  ;
  auStack_360._0_8_ = ((dVar69 + ((double)auStack_360._0_8_ - dVar55) + dVar65) - dVar40) - dVar37;
  dVar54 = adStack_600[6] * -5282.492258864639;
  local_308 = (local_308 - dVar73) - dVar54;
  adStack_600[5] = adStack_600[5] * 5672469.694980093;
  local_2b8 = local_2b8 - adStack_600[5];
  dVar59 = adStack_600[8] * adStack_600[6] * 1000000.0 +
           adStack_600[7] * adStack_600[3] * -43.95116952269832;
  dVar26 = adStack_600[8] * adStack_600[6] * 0.0 +
           (0.0 - ((local_548 + local_528) - (dStack_530 + dStack_520)) * 0.0006666666666666666) *
           -43.95116952269832 * adStack_600[7] * adStack_600[3];
  dVar24 = adStack_600[7] * -43.95116952269832;
  dVar49 = adStack_600[8] * 1000000.0;
  dVar53 = adStack_600[3] * -43.95116952269832;
  dVar28 = adStack_600[6] * 1000000.0;
  dVar56 = adStack_600[8] * adStack_600[6] * 23496864.50220335 +
           adStack_600[7] * adStack_600[3] * -1032.714674988212;
  dVar25 = adStack_600[8] * adStack_600[6] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((local_548 + local_528) - (dStack_530 + dStack_520)) * 0.0006666666666666666) *
           -1032.714674988212 * adStack_600[7] * adStack_600[3];
  local_598 = dVar11 + dVar62 + dVar66 + dVar59 + dVar56;
  dStack_580 = ((dVar31 + ((dVar70 + dVar70 +
                            dVar39 + dVar39 + ((dVar38 + dVar64 + dStack_580) - dVar71) + dVar41) -
                          dVar62) + dVar66) - dVar59) - dVar56;
  local_578._8_8_ =
       (((((dVar68 + dVar60 + (double)local_578._8_8_) - dVar66) - dVar30) - dVar31) - dVar59) -
       dVar56;
  local_578._0_8_ =
       dVar31 + (((((((double)local_578._0_8_ - dVar45) - dVar70) - dVar41) - dVar62) -
                 (dVar60 + dVar60)) - (dVar68 + dVar68)) + dVar30 + dVar59 + dVar56;
  adStack_600[7] = adStack_600[7] * -1032.714674988212;
  adStack_4c0[0xd] =
       ((dVar27 + adStack_4c0[0xd]) - dVar57) + dVar44 + dVar43 + dVar24 + adStack_600[7];
  adStack_4c0[0x10] =
       ((((dVar57 + dVar57 + (adStack_4c0[0x10] - dVar27)) - dVar44) + dVar43) - dVar24) -
       adStack_600[7];
  adStack_4c0[0x11] = (adStack_4c0[0x11] - dVar44) + dVar24 + adStack_600[7];
  adStack_4c0[0x12] = ((adStack_4c0[0x12] - dVar43) - dVar24) - adStack_600[7];
  adStack_600[8] = adStack_600[8] * 23496864.50220335;
  adStack_4c0[0x2b] =
       ((dVar69 + adStack_4c0[0x2b]) - dVar29) + dVar75 + dVar37 + dVar49 + adStack_600[8];
  local_350 = ((dVar48 + ((dVar40 + dVar40 +
                           dVar29 + dVar29 + ((dVar65 + dVar55 + local_350) - dVar69) + dVar32) -
                         dVar75) + dVar37) - dVar49) - adStack_600[8];
  dStack_348 = dVar48 + (((dStack_348 - dVar40) - dVar32) - dVar75) + dVar49 + adStack_600[8];
  adStack_600[3] = adStack_600[3] * -1032.714674988212;
  local_340 = (((local_340 - dVar37) - dVar48) - dVar49) - adStack_600[8];
  local_318 = local_318 + dVar53 + adStack_600[3];
  dStack_320 = dVar63 + dVar34 + dVar35;
  dStack_2f8 = dVar54 + ((dStack_2f8 - (dVar34 + dVar34)) - (dVar35 + dVar35)) + adStack_600[1] +
               dVar53 + adStack_600[3];
  local_300 = ((dVar54 + dVar9) - dVar53) - adStack_600[3];
  local_2f0 = ((((dVar35 + dVar34 + local_2f0) - adStack_600[1]) - dVar54) - dVar53) -
              adStack_600[3];
  adStack_600[6] = adStack_600[6] * 23496864.50220335;
  local_2c8 = local_2c8 + dVar23 + dVar28 + adStack_600[6];
  local_2b0 = ((adStack_600[5] + local_2b0 + dVar23) - dVar28) - adStack_600[6];
  dStack_2a8 = adStack_600[5] +
               ((dStack_2a8 - (dVar42 + dVar42)) - (adStack_600[2] + adStack_600[2])) +
               adStack_600[4] + dVar28 + adStack_600[6];
  local_2a0 = (((((adStack_600[2] + dVar42 + local_2a0) - dVar23) - adStack_600[4]) - adStack_600[5]
               ) - dVar28) - adStack_600[6];
  local_238[3] = ((local_238[3] - dVar58) - dVar61) - dVar79;
  local_238[2] = dVar22 + dVar51 + dVar61 + dVar26 + dVar25;
  local_238[5] = ((dVar47 + ((dVar58 + dVar58 + dVar78 + dVar78 + local_238[5] + dVar46) - dVar51) +
                            dVar61) - dVar26) - dVar25;
  local_238[4] = (dVar10 - dVar46) - dVar47;
  local_238[6] = dVar47 + ((((((local_238[6] - dVar80) - dVar58) - dVar46) - dVar51) -
                           (dVar50 + dVar50)) - (dVar33 + dVar33)) + dVar79 + dVar26 + dVar25;
  local_238[7] = (((((dVar33 + local_238[7] + dVar50) - dVar61) - dVar79) - dVar47) - dVar26) -
                 dVar25;
  if (iVar14 == 0) {
    local_118[0] = 2.8916149455543745;
    local_118[1] = 3.3887808219431252;
    local_118[2] = 4.665255136408125;
    local_118[3] = 1.5;
    local_118[4] = 1.506900950283125;
    local_118[5] = 2.9628176357525002;
    local_118[6] = 5.2821630604062495;
    local_118[7] = 7.4795990834;
    local_118[8] = 3.1861205355625004;
    local_c8[0] = 0.00049010354654;
    local_c8[1] = 0.000340356715215;
    local_c8[2] = 0.0011616005819375;
    local_c8[3] = 0.0;
    local_c8[4] = -1.20361935e-05;
    local_c8[5] = 0.00046729736768999996;
    local_c8[6] = 0.0009643321552500001;
    local_c8[7] = 0.0013043066091500003;
    local_c8[8] = 0.00037292866150000014;
    pdVar13 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_118[0] = 3.8916149455543745;
    local_118[1] = 4.388780821943126;
    local_118[2] = 5.665255136408124;
    local_118[3] = 2.5;
    local_118[4] = 2.506900950283125;
    local_118[5] = 3.9628176357525002;
    local_118[6] = 6.28216306040625;
    local_118[7] = 8.4795990834;
    local_118[8] = 4.1861205355625;
    local_c8[0] = 0.00049010354654;
    local_c8[1] = 0.000340356715215;
    local_c8[2] = 0.0011616005819375;
    local_c8[3] = 0.0;
    local_c8[4] = -1.20361935e-05;
    local_c8[5] = 0.00046729736768999996;
    local_c8[6] = 0.0009643321552500001;
    local_c8[7] = 0.0013043066091500003;
    local_c8[8] = 0.00037292866150000014;
    pdVar13 = &local_558;
  }
  dVar53 = 0.0;
  dVar46 = 0.0;
  dVar47 = 0.0;
  lVar12 = 0;
  dVar22 = 0.0;
  do {
    dVar63 = *(double *)((long)adStack_600 + lVar12 + 8);
    dVar22 = dVar22 + *(double *)((long)local_118 + lVar12) * dVar63;
    dVar54 = *(double *)((long)pdVar13 + lVar12);
    dVar53 = dVar53 + dVar63 * *(double *)((long)local_c8 + lVar12);
    dVar46 = dVar46 + *(double *)(local_5a8 + lVar12) * dVar54;
    dVar47 = dVar47 + (*(double *)((long)local_118 + lVar12) - dVar54) * 0.0006666666666666666 *
                      *(double *)(local_5a8 + lVar12) +
                      dVar54 * *(double *)((long)local_238 + lVar12);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x48);
  dVar46 = dVar46 * (1.0 / dVar22);
  dVar63 = (1.0 / dVar22) * 1500.0;
  dVar22 = dVar46 * dVar63;
  lVar12 = 0;
  do {
    dVar54 = 0.0;
    lVar15 = 0;
    do {
      dVar54 = dVar54 + pdVar13[lVar15] * pdVar18[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 9);
    adStack_4c0[lVar12 * 10] = local_118[lVar12] * dVar22 + dVar54 * -dVar63;
    lVar12 = lVar12 + 1;
    pdVar18 = pdVar18 + 10;
  } while (lVar12 != 9);
  local_1f0 = (dVar22 * dVar53 - dVar46) - dVar63 * dVar47;
  if (local_14c == 1) {
    *rowPtr = 1;
    if (0 < NCELLS) {
      iVar14 = 1;
      iVar20 = 1;
      uVar17 = 0;
      do {
        pdVar18 = &local_508;
        lVar12 = 0;
        lVar15 = 0;
        do {
          lVar16 = 0;
          iVar21 = iVar20;
          do {
            iVar19 = (int)uVar17 * 10 + 1 + (int)lVar15;
            if (((lVar12 == lVar16) || (iVar19 = iVar21, *(double *)((long)pdVar18 + lVar16) != 0.0)
                ) || (NAN(*(double *)((long)pdVar18 + lVar16)))) {
              colVals[(long)iVar14 + -1] = iVar19;
              iVar14 = iVar14 + 1;
            }
            lVar16 = lVar16 + 0x50;
            iVar21 = iVar21 + 1;
          } while (lVar16 != 800);
          rowPtr[uVar17 * 10 + lVar15 + 1] = iVar14;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x50;
          pdVar18 = pdVar18 + 1;
        } while (lVar15 != 10);
        uVar17 = uVar17 + 1;
        iVar20 = iVar20 + 10;
      } while (uVar17 != (uint)NCELLS);
    }
  }
  else {
    *rowPtr = 0;
    if (0 < NCELLS) {
      uVar17 = 0;
      iVar14 = 0;
      do {
        lVar12 = 0;
        pdVar18 = &local_508;
        do {
          lVar15 = 0;
          pdVar13 = pdVar18;
          do {
            iVar20 = (int)lVar12;
            if (lVar12 == lVar15) {
LAB_00138d66:
              colVals[iVar14] = iVar20 + (int)uVar17 * 10;
              iVar14 = iVar14 + 1;
            }
            else {
              iVar20 = (int)lVar15;
              if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) goto LAB_00138d66;
            }
            lVar15 = lVar15 + 1;
            pdVar13 = pdVar13 + 10;
          } while (lVar15 != 10);
          rowPtr[uVar17 * 10 + lVar12 + 1] = iVar14;
          lVar12 = lVar12 + 1;
          pdVar18 = pdVar18 + 1;
        } while (lVar12 != 10);
        uVar17 = uVar17 + 1;
      } while (uVar17 != (uint)NCELLS);
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_CSR(
  int* colVals, int* rowPtr, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp - 1] = l + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp - 1] = k + 1 + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp] = l + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp] = k + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}